

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void wallet::HandleWalletError
               (shared_ptr<wallet::CWallet> *wallet,DatabaseStatus *status,bilingual_str *error)

{
  bool bVar1;
  undefined8 uVar2;
  string *in_RSI;
  long in_FS_OFFSET;
  RPCErrorCode code;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffa8;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_stack_ffffffffffffffa8);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
  }
  else {
    switch(*(undefined4 *)&(in_RSI->_M_dataplus)._M_p) {
    case 2:
    case 5:
      break;
    case 3:
      break;
    case 4:
      break;
    default:
      break;
    case 10:
    }
    uVar2 = __cxa_allocate_exception(0x58);
    JSONRPCError((int)((ulong)lVar3 >> 0x20),in_RSI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

void HandleWalletError(const std::shared_ptr<CWallet> wallet, DatabaseStatus& status, bilingual_str& error)
{
    if (!wallet) {
        // Map bad format to not found, since bad format is returned when the
        // wallet directory exists, but doesn't contain a data file.
        RPCErrorCode code = RPC_WALLET_ERROR;
        switch (status) {
            case DatabaseStatus::FAILED_NOT_FOUND:
            case DatabaseStatus::FAILED_BAD_FORMAT:
                code = RPC_WALLET_NOT_FOUND;
                break;
            case DatabaseStatus::FAILED_ALREADY_LOADED:
                code = RPC_WALLET_ALREADY_LOADED;
                break;
            case DatabaseStatus::FAILED_ALREADY_EXISTS:
                code = RPC_WALLET_ALREADY_EXISTS;
                break;
            case DatabaseStatus::FAILED_INVALID_BACKUP_FILE:
                code = RPC_INVALID_PARAMETER;
                break;
            default: // RPC_WALLET_ERROR is returned for all other cases.
                break;
        }
        throw JSONRPCError(code, error.original);
    }
}